

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> * __thiscall
fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char>
           *__return_storage_ptr__,v10 *this,char *args)

{
  char *args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> *local_38;
  
  local_38._0_1_ = (__return_storage_ptr__->data_).args_[0].field_0.bool_value;
  return local_38;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}